

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O3

void secp256k1_modinv32_normalize_30
               (secp256k1_modinv32_signed30 *r,int32_t sign,secp256k1_modinv32_modinfo *modinfo)

{
  secp256k1_scalar *a;
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  uint32_t uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int extraout_EDX;
  int extraout_EDX_00;
  ulong uVar10;
  long *extraout_RDX;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  uint64_t uVar14;
  uint uVar15;
  uint uVar16;
  undefined4 in_register_00000034;
  secp256k1_fe *psVar17;
  ulong uVar18;
  secp256k1_fe *r_00;
  uint uVar19;
  secp256k1_modinv32_signed30 *psVar20;
  ulong uVar21;
  secp256k1_fe *r_01;
  secp256k1_fe *psVar22;
  uchar *__s;
  uint uVar23;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  uint64_t uVar28;
  size_t count;
  uint64_t uVar29;
  secp256k1_fe *a_00;
  uint uVar30;
  uint64_t uVar31;
  code *pcVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int32_t cond_add;
  int32_t cond_negate;
  ulong uStack_1290;
  secp256k1_fe *psStack_1288;
  uchar auStack_1280 [4232];
  secp256k1_fe *psStack_1f8;
  ulong uStack_1f0;
  uint64_t uStack_1e8;
  secp256k1_fe *psStack_1e0;
  code *pcStack_1d8;
  code *pcStack_1d0;
  undefined1 auStack_1c8 [36];
  int iStack_1a4;
  int iStack_1a0;
  int iStack_19c;
  int iStack_198;
  int iStack_194;
  int iStack_190;
  int iStack_18c;
  undefined1 auStack_188 [48];
  code *pcStack_158;
  long lStack_148;
  secp256k1_fe sStack_140;
  secp256k1_fe *psStack_108;
  secp256k1_fe sStack_100;
  secp256k1_fe sStack_d0;
  ulong uStack_98;
  ulong uStack_90;
  ulong uStack_88;
  secp256k1_modinv32_signed30 *psStack_80;
  ulong uStack_78;
  code *pcStack_70;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  secp256k1_modinv32_modinfo *local_50;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  int32_t local_34;
  
  psVar17 = (secp256k1_fe *)CONCAT44(in_register_00000034,sign);
  uVar7 = r->v[0];
  uVar18 = (ulong)uVar7;
  uVar9 = r->v[3];
  uVar10 = (ulong)uVar9;
  uVar15 = r->v[4];
  uVar13 = (ulong)uVar15;
  uVar12 = r->v[5];
  uVar26 = (ulong)uVar12;
  psVar20 = (secp256k1_modinv32_signed30 *)(ulong)(uint)r->v[6];
  uVar16 = r->v[7];
  uVar6 = (ulong)uVar16;
  local_34 = r->v[8];
  lVar5 = 0;
  do {
    if (r->v[lVar5] < -0x3fffffff) {
      pcStack_70 = (code *)0x14adac;
      secp256k1_modinv32_normalize_30_cold_7();
LAB_0014adac:
      pcStack_70 = (code *)0x14adb1;
      secp256k1_modinv32_normalize_30_cold_6();
      goto LAB_0014adb1;
    }
    if (0x3fffffff < r->v[lVar5]) goto LAB_0014adac;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 9);
  psVar17 = (secp256k1_fe *)0x9;
  pcStack_70 = (code *)0x14aae9;
  psVar20 = r;
  local_60 = r->v[1];
  local_5c = r->v[2];
  local_58 = r->v[6];
  local_54 = sign;
  local_50 = modinfo;
  iVar1 = secp256k1_modinv32_mul_cmp_30(r,9,&modinfo->modulus,-2);
  if (iVar1 < 1) {
LAB_0014adb1:
    pcStack_70 = (code *)0x14adb6;
    secp256k1_modinv32_normalize_30_cold_5();
LAB_0014adb6:
    pcStack_70 = (code *)0x14adbb;
    secp256k1_modinv32_normalize_30_cold_4();
LAB_0014adbb:
    pcStack_70 = (code *)0x14adc0;
    secp256k1_modinv32_normalize_30_cold_3();
LAB_0014adc0:
    pcStack_70 = (code *)0x14adc5;
    secp256k1_modinv32_normalize_30_cold_2();
  }
  else {
    psVar17 = (secp256k1_fe *)0x9;
    pcStack_70 = (code *)0x14ab08;
    psVar20 = r;
    iVar1 = secp256k1_modinv32_mul_cmp_30(r,9,&local_50->modulus,1);
    if (-1 < iVar1) goto LAB_0014adb6;
    uVar2 = local_34 >> 0x1f;
    uVar19 = (local_50->modulus).v[0];
    local_38 = (local_50->modulus).v[1];
    uVar3 = (uVar2 & local_38) + local_60;
    local_60 = (local_50->modulus).v[2];
    uVar8 = (uVar2 & local_60) + local_5c;
    local_5c = (local_50->modulus).v[3];
    local_3c = (local_50->modulus).v[4];
    local_40 = (local_50->modulus).v[5];
    local_44 = (local_50->modulus).v[6];
    uVar27 = (uVar2 & local_44) + local_58;
    local_58 = (local_50->modulus).v[7];
    local_64 = (int)local_54 >> 0x1f;
    local_54 = (local_50->modulus).v[8];
    uVar25 = ((uVar2 & uVar19) + uVar7 ^ local_64) - local_64;
    uVar23 = ((int)uVar25 >> 0x1e) + ((uVar3 ^ local_64) - local_64);
    uVar3 = ((int)uVar23 >> 0x1e) + ((uVar8 ^ local_64) - local_64);
    uVar30 = ((int)uVar3 >> 0x1e) + (((uVar2 & local_5c) + uVar9 ^ local_64) - local_64);
    uVar9 = ((int)uVar30 >> 0x1e) + (((uVar2 & local_3c) + uVar15 ^ local_64) - local_64);
    uVar7 = ((int)uVar9 >> 0x1e) + (((uVar2 & local_40) + uVar12 ^ local_64) - local_64);
    uVar15 = ((int)uVar7 >> 0x1e) + ((uVar27 ^ local_64) - local_64);
    uVar12 = ((int)uVar15 >> 0x1e) + (((uVar2 & local_58) + uVar16 ^ local_64) - local_64);
    uVar27 = ((int)uVar12 >> 0x1e) + (((uVar2 & local_54) + local_34 ^ local_64) - local_64);
    uVar26 = (ulong)uVar27;
    local_68 = (int)uVar27 >> 0x1f;
    uVar25 = (uVar19 & local_68) + (uVar25 & 0x3fffffff);
    uVar2 = (local_40 & local_68) + (uVar7 & 0x3fffffff);
    uVar18 = (ulong)uVar2;
    uVar8 = (local_44 & local_68) + (uVar15 & 0x3fffffff);
    uVar10 = (ulong)uVar8;
    uVar7 = ((int)uVar25 >> 0x1e) + (local_38 & local_68) + (uVar23 & 0x3fffffff);
    uVar15 = ((int)uVar7 >> 0x1e) + (local_60 & local_68) + (uVar3 & 0x3fffffff);
    uVar16 = ((int)uVar15 >> 0x1e) + (local_5c & local_68) + (uVar30 & 0x3fffffff);
    uVar19 = ((int)uVar16 >> 0x1e) + (local_3c & local_68) + (uVar9 & 0x3fffffff);
    uVar2 = ((int)uVar19 >> 0x1e) + uVar2;
    uVar8 = ((int)uVar2 >> 0x1e) + uVar8;
    uVar9 = ((int)uVar8 >> 0x1e) + (local_58 & local_68) + (uVar12 & 0x3fffffff);
    uVar12 = ((int)uVar9 >> 0x1e) + (local_54 & local_68) + uVar27;
    uVar13 = (ulong)uVar12;
    uVar16 = uVar16 & 0x3fffffff;
    psVar17 = (secp256k1_fe *)(ulong)uVar16;
    uVar19 = uVar19 & 0x3fffffff;
    psVar20 = (secp256k1_modinv32_signed30 *)(ulong)uVar19;
    uVar9 = uVar9 & 0x3fffffff;
    uVar6 = (ulong)uVar9;
    r->v[0] = uVar25 & 0x3fffffff;
    r->v[1] = uVar7 & 0x3fffffff;
    r->v[2] = uVar15 & 0x3fffffff;
    r->v[3] = uVar16;
    r->v[4] = uVar19;
    r->v[5] = uVar2 & 0x3fffffff;
    r->v[6] = uVar8 & 0x3fffffff;
    r->v[7] = uVar9;
    r->v[8] = uVar12;
    if (0x3fffffff < uVar12) goto LAB_0014adbb;
    psVar17 = (secp256k1_fe *)0x9;
    pcStack_70 = (code *)0x14ad79;
    psVar20 = r;
    iVar1 = secp256k1_modinv32_mul_cmp_30(r,9,&local_50->modulus,0);
    if (iVar1 < 0) goto LAB_0014adc0;
    psVar17 = (secp256k1_fe *)0x9;
    pcStack_70 = (code *)0x14ad94;
    psVar20 = r;
    iVar1 = secp256k1_modinv32_mul_cmp_30(r,9,&local_50->modulus,1);
    if (iVar1 < 0) {
      return;
    }
  }
  pcStack_70 = test_inverse_field;
  secp256k1_modinv32_normalize_30_cold_1();
  psStack_108 = (secp256k1_fe *)secp256k1_fe_inv_var;
  if (extraout_EDX == 0) {
    psStack_108 = (secp256k1_fe *)secp256k1_fe_inv;
  }
  pcStack_158 = (code *)0x14ae01;
  uStack_98 = uVar6;
  uStack_90 = uVar26;
  uStack_88 = uVar10;
  psStack_80 = r;
  uStack_78 = uVar18;
  pcStack_70 = (code *)uVar13;
  (*(code *)psStack_108)(&sStack_140);
  if (psVar20 != (secp256k1_modinv32_signed30 *)0x0) {
    *(uint64_t *)(psVar20->v + 8) = sStack_140.n[4];
    *(ulong *)(psVar20[1].v + 1) = CONCAT44(sStack_140.normalized,sStack_140.magnitude);
    *(uint64_t *)(psVar20->v + 4) = sStack_140.n[2];
    *(uint64_t *)(psVar20->v + 6) = sStack_140.n[3];
    *(uint64_t *)psVar20->v = sStack_140.n[0];
    *(uint64_t *)(psVar20->v + 2) = sStack_140.n[1];
  }
  uVar31 = 0xfffffffffffff;
  uVar28 = 0xf000000000000;
  uVar13 = 0xffffffffffff;
  uVar26 = 0x1000003d0;
  sStack_d0.n[0] = psVar17->n[0];
  sStack_d0.n[1] = psVar17->n[1];
  sStack_d0.n[2] = psVar17->n[2];
  sStack_d0.n[3] = psVar17->n[3];
  sStack_d0.n[4] = psVar17->n[4];
  sStack_d0.magnitude = psVar17->magnitude;
  sStack_d0.normalized = psVar17->normalized;
  a_00 = &sStack_d0;
  pcStack_158 = (code *)0x14ae78;
  secp256k1_fe_verify(a_00);
  lStack_148 = 0x1000003d1;
  uVar6 = (sStack_d0.n[4] >> 0x30) * 0x1000003d1 + sStack_d0.n[0];
  if (((uVar6 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar6 & 0xfffffffffffff) == 0)) {
    uVar10 = (uVar6 >> 0x34) + sStack_d0.n[1];
    uVar18 = (uVar10 >> 0x34) + sStack_d0.n[2];
    uVar21 = (uVar18 >> 0x34) + sStack_d0.n[3];
    uVar24 = (uVar21 >> 0x34) + (sStack_d0.n[4] & 0xffffffffffff);
    if ((((uVar10 | uVar6 | uVar18 | uVar21) & 0xfffffffffffff) != 0 || uVar24 != 0) &&
       (((uVar6 | 0x1000003d0) & uVar10 & uVar18 & uVar21 & (uVar24 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_0014af1b;
LAB_0014b32f:
    psVar17 = &sStack_140;
    pcStack_158 = (code *)0x14b33c;
    secp256k1_fe_verify(psVar17);
    uVar13 = uVar13 & sStack_140.n[4];
    uVar6 = (sStack_140.n[4] >> 0x30) * lStack_148 + sStack_140.n[0];
    uVar10 = (uVar6 >> 0x34) + sStack_140.n[1];
    uVar18 = (uVar10 >> 0x34) + sStack_140.n[2];
    r_00 = (secp256k1_fe *)((uVar18 >> 0x34) + sStack_140.n[3]);
    uVar21 = ((ulong)r_00 >> 0x34) + uVar13;
    if ((((uVar10 | uVar6 | uVar18 | (ulong)r_00) & uVar31) == 0 && uVar21 == 0) ||
       (r_01 = (secp256k1_fe *)(uVar21 ^ uVar28),
       ((uVar6 ^ uVar26) & uVar10 & uVar18 & (ulong)r_00 & (ulong)r_01) == uVar31)) {
      return;
    }
  }
  else {
LAB_0014af1b:
    pcStack_158 = (code *)0x14af33;
    r_00 = psVar17;
    secp256k1_fe_mul(&sStack_d0,psVar17,&sStack_140);
    pcStack_158 = (code *)0x14af3b;
    secp256k1_fe_verify(&sStack_d0);
    r_01 = &fe_minus_one;
    pcStack_158 = (code *)0x14af47;
    secp256k1_fe_verify(&fe_minus_one);
    if (sStack_d0.magnitude < 0x20) {
      sStack_d0.n[0] = sStack_d0.n[0] + 0xffffefffffc2e;
      sStack_d0.n[1] = sStack_d0.n[1] + 0xfffffffffffff;
      sStack_d0.n[2] = sStack_d0.n[2] + 0xfffffffffffff;
      sStack_d0.n[3] = sStack_d0.n[3] + 0xfffffffffffff;
      sStack_d0.n[4] = sStack_d0.n[4] + 0xffffffffffff;
      sStack_d0.normalized = 0;
      sStack_d0.magnitude = sStack_d0.magnitude + 1;
      pcStack_158 = (code *)0x14af9c;
      secp256k1_fe_verify(&sStack_d0);
      pcStack_158 = (code *)0x14afa4;
      secp256k1_fe_verify(&sStack_d0);
      uVar6 = (sStack_d0.n[4] >> 0x30) * lStack_148 + sStack_d0.n[0];
      uVar13 = (uVar6 >> 0x34) + sStack_d0.n[1];
      uVar10 = (uVar13 >> 0x34) + sStack_d0.n[2];
      r_00 = (secp256k1_fe *)((uVar10 >> 0x34) + sStack_d0.n[3]);
      uVar18 = ((ulong)r_00 >> 0x34) + (sStack_d0.n[4] & 0xffffffffffff);
      if ((((uVar13 | uVar6 | uVar10 | (ulong)r_00) & 0xfffffffffffff) != 0 || uVar18 != 0) &&
         (r_01 = (secp256k1_fe *)(uVar18 ^ 0xf000000000000),
         ((uVar6 ^ 0x1000003d0) & uVar13 & uVar10 & (ulong)r_00 & (ulong)r_01) != 0xfffffffffffff))
      goto LAB_0014b3bd;
      sStack_100.n[0] = psVar17->n[0];
      sStack_100.n[1] = psVar17->n[1];
      sStack_100.n[2] = psVar17->n[2];
      sStack_100.n[3] = psVar17->n[3];
      sStack_100.n[4] = psVar17->n[4];
      sStack_100.magnitude = psVar17->magnitude;
      sStack_100.normalized = psVar17->normalized;
      psVar17 = &sStack_100;
      pcStack_158 = (code *)0x14b03c;
      secp256k1_fe_verify(psVar17);
      r_01 = &fe_minus_one;
      pcStack_158 = (code *)0x14b048;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_100.magnitude) goto LAB_0014b3c2;
      uVar14 = sStack_100.n[0] + 0xffffefffffc2e;
      uVar29 = sStack_100.n[1] + 0xfffffffffffff;
      uVar31 = sStack_100.n[2] + 0xfffffffffffff;
      uVar28 = sStack_100.n[3] + 0xfffffffffffff;
      uVar26 = sStack_100.n[4] + 0xffffffffffff;
      sStack_100.normalized = 0;
      sStack_100.magnitude = sStack_100.magnitude + 1;
      pcStack_158 = (code *)0x14b0bd;
      sStack_100.n[0] = uVar14;
      sStack_100.n[1] = uVar29;
      sStack_100.n[2] = uVar31;
      sStack_100.n[3] = uVar28;
      sStack_100.n[4] = uVar26;
      secp256k1_fe_verify(&sStack_100);
      pcStack_158 = (code *)0x14b0c5;
      secp256k1_fe_verify(&sStack_100);
      a_00 = psStack_108;
      uVar6 = (uVar26 >> 0x30) * lStack_148 + uVar14;
      if (((uVar6 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar6 & 0xfffffffffffff) == 0)) {
        uVar26 = uVar26 & 0xffffffffffff;
        uVar21 = uVar29 + (uVar6 >> 0x34);
        uVar13 = (uVar21 >> 0x34) + uVar31;
        uVar10 = (uVar13 >> 0x34) + uVar28;
        uVar18 = (uVar10 >> 0x34) + uVar26;
        if (((uVar21 | uVar6 | uVar13 | uVar10) & 0xfffffffffffff) == 0 && uVar18 == 0) {
          return;
        }
        if (((uVar6 | 0x1000003d0) & uVar21 & uVar13 & uVar10 & (uVar18 ^ 0xf000000000000)) ==
            0xfffffffffffff) {
          return;
        }
      }
      r_00 = &sStack_100;
      pcStack_158 = (code *)0x14b185;
      (*(code *)psStack_108)();
      psVar17 = &sStack_140;
      pcStack_158 = (code *)0x14b192;
      secp256k1_fe_verify(psVar17);
      r_01 = &fe_minus_one;
      pcStack_158 = (code *)0x14b19e;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_140.magnitude) goto LAB_0014b3c7;
      psVar17 = &sStack_140;
      sStack_140.n[0] = sStack_140.n[0] + 0xffffefffffc2e;
      sStack_140.n[1] = sStack_140.n[1] + 0xfffffffffffff;
      sStack_140.n[2] = sStack_140.n[2] + 0xfffffffffffff;
      sStack_140.n[3] = sStack_140.n[3] + 0xfffffffffffff;
      sStack_140.n[4] = sStack_140.n[4] + 0xffffffffffff;
      sStack_140.magnitude = sStack_140.magnitude + 1;
      uVar13 = 0;
      sStack_140.normalized = 0;
      pcStack_158 = (code *)0x14b1e7;
      secp256k1_fe_verify(psVar17);
      pcStack_158 = (code *)0x14b1f0;
      r_00 = psVar17;
      (*(code *)a_00)(psVar17);
      pcStack_158 = (code *)0x14b1f8;
      secp256k1_fe_verify(psVar17);
      sStack_140.n[0] = sStack_140.n[0] + 1;
      sStack_140.magnitude = sStack_140.magnitude + 1;
      sStack_140.normalized = 0;
      pcStack_158 = (code *)0x14b209;
      secp256k1_fe_verify(psVar17);
      pcStack_158 = (code *)0x14b211;
      secp256k1_fe_verify(psVar17);
      a_00 = &sStack_100;
      pcStack_158 = (code *)0x14b21e;
      r_01 = a_00;
      secp256k1_fe_verify(a_00);
      if (sStack_100.magnitude + sStack_140.magnitude < 0x21) {
        sStack_140.n[0] = sStack_140.n[0] + sStack_100.n[0];
        sStack_140.n[1] = sStack_140.n[1] + sStack_100.n[1];
        sStack_140.n[2] = sStack_140.n[2] + sStack_100.n[2];
        sStack_140.n[3] = sStack_140.n[3] + sStack_100.n[3];
        sStack_140.n[4] = sStack_140.n[4] + sStack_100.n[4];
        sStack_140.normalized = 0;
        pcStack_158 = (code *)0x14b26c;
        sStack_140.magnitude = sStack_100.magnitude + sStack_140.magnitude;
        secp256k1_fe_verify(&sStack_140);
        pcStack_158 = (code *)0x14b274;
        secp256k1_fe_verify(&sStack_140);
        uVar6 = (sStack_140.n[4] >> 0x30) * lStack_148 + sStack_140.n[0];
        if (((uVar6 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar6 & 0xfffffffffffff) == 0)) {
          uVar10 = (uVar6 >> 0x34) + sStack_140.n[1];
          uVar18 = (uVar10 >> 0x34) + sStack_140.n[2];
          uVar21 = (uVar18 >> 0x34) + sStack_140.n[3];
          uVar24 = (uVar21 >> 0x34) + (sStack_140.n[4] & 0xffffffffffff);
          if (((uVar10 | uVar6 | uVar18 | uVar21) & 0xfffffffffffff) == 0 && uVar24 == 0) {
            return;
          }
          if (((uVar6 | 0x1000003d0) & uVar10 & uVar18 & uVar21 & (uVar24 ^ 0xf000000000000)) ==
              0xfffffffffffff) {
            return;
          }
        }
        pcStack_158 = (code *)0x14b32f;
        test_inverse_field_cold_2();
        goto LAB_0014b32f;
      }
    }
    else {
      pcStack_158 = (code *)0x14b3bd;
      test_inverse_field_cold_7();
LAB_0014b3bd:
      pcStack_158 = (code *)0x14b3c2;
      test_inverse_field_cold_6();
LAB_0014b3c2:
      a_00 = &sStack_d0;
      pcStack_158 = (code *)0x14b3c7;
      test_inverse_field_cold_5();
LAB_0014b3c7:
      uVar13 = 0xffffffffffff;
      pcStack_158 = (code *)0x14b3cc;
      test_inverse_field_cold_4();
    }
    pcStack_158 = (code *)0x14b3d1;
    test_inverse_field_cold_3();
  }
  pcStack_158 = test_inverse_scalar;
  test_inverse_field_cold_1();
  psVar22 = (secp256k1_fe *)auStack_1c8;
  pcVar32 = secp256k1_scalar_inverse_var;
  if (extraout_EDX_00 == 0) {
    pcVar32 = secp256k1_scalar_inverse;
  }
  pcStack_1d0 = (code *)0x14b3ff;
  auStack_188._32_8_ = psVar17;
  auStack_188._40_8_ = a_00;
  pcStack_158 = (code *)uVar31;
  (*pcVar32)(auStack_1c8);
  if (r_01 != (secp256k1_fe *)0x0) {
    r_01->n[2] = CONCAT44(auStack_1c8._20_4_,auStack_1c8._16_4_);
    r_01->n[3] = CONCAT44(auStack_1c8._28_4_,auStack_1c8._24_4_);
    r_01->n[0] = CONCAT44(auStack_1c8._4_4_,auStack_1c8._0_4_);
    r_01->n[1] = CONCAT44(auStack_1c8._12_4_,auStack_1c8._8_4_);
  }
  pcStack_1d0 = (code *)0x14b41e;
  secp256k1_scalar_verify((secp256k1_scalar *)r_00);
  auVar33._0_4_ = -(uint)((int)r_00->n[2] == 0 && (int)r_00->n[0] == 0);
  auVar33._4_4_ = -(uint)(*(int *)((long)r_00->n + 0x14) == 0 && *(int *)((long)r_00->n + 4) == 0);
  auVar33._8_4_ = -(uint)((int)r_00->n[3] == 0 && (int)r_00->n[1] == 0);
  auVar33._12_4_ =
       -(uint)(*(int *)((long)r_00->n + 0x1c) == 0 && *(int *)((long)r_00->n + 0xc) == 0);
  iVar1 = movmskps(extraout_EAX,auVar33);
  if (iVar1 != 0xf) {
    r_01 = (secp256k1_fe *)auStack_188;
    pcStack_1d0 = (code *)0x14b452;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)r_01,(secp256k1_scalar *)r_00,(secp256k1_scalar *)auStack_1c8);
    pcStack_1d0 = (code *)0x14b45a;
    psVar17 = r_01;
    secp256k1_scalar_verify((secp256k1_scalar *)r_01);
    if (((auStack_188._0_8_ != 1 || auStack_188._8_8_ != 0) || auStack_188._16_8_ != 0) ||
        auStack_188._24_8_ != 0) {
      pcStack_1d0 = (code *)0x14b564;
      test_inverse_scalar_cold_1();
      goto LAB_0014b564;
    }
    pcStack_1d0 = (code *)0x14b48a;
    secp256k1_scalar_add
              ((secp256k1_scalar *)(auStack_1c8 + 0x20),(secp256k1_scalar *)r_00,&scalar_minus_one);
    pcStack_1d0 = (code *)0x14b492;
    secp256k1_scalar_verify((secp256k1_scalar *)(auStack_1c8 + 0x20));
    auVar34._0_4_ = -(uint)(iStack_198 == 0 && auStack_1c8._32_4_ == 0);
    auVar34._4_4_ = -(uint)(iStack_194 == 0 && iStack_1a4 == 0);
    auVar34._8_4_ = -(uint)(iStack_190 == 0 && iStack_1a0 == 0);
    auVar34._12_4_ = -(uint)(iStack_18c == 0 && iStack_19c == 0);
    iVar1 = movmskps(extraout_EAX_00,auVar34);
    if (iVar1 == 0xf) {
      return;
    }
    a = (secp256k1_scalar *)(auStack_1c8 + 0x20);
    pcStack_1d0 = (code *)0x14b4c3;
    (*pcVar32)(a,a);
    pcStack_1d0 = (code *)0x14b4d8;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_1c8,&scalar_minus_one,(secp256k1_scalar *)auStack_1c8);
    pcStack_1d0 = (code *)0x14b4e1;
    (*pcVar32)(auStack_1c8,auStack_1c8);
    pcStack_1d0 = (code *)0x14b4f3;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_1c8,(secp256k1_scalar *)auStack_1c8,&secp256k1_scalar_one
              );
    pcStack_1d0 = (code *)0x14b501;
    secp256k1_scalar_add((secp256k1_scalar *)auStack_1c8,a,(secp256k1_scalar *)auStack_1c8);
    pcStack_1d0 = (code *)0x14b509;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_1c8);
    auVar35._0_4_ = -(uint)(auStack_1c8._16_4_ == 0 && auStack_1c8._0_4_ == 0);
    auVar35._4_4_ = -(uint)(auStack_1c8._20_4_ == 0 && auStack_1c8._4_4_ == 0);
    auVar35._8_4_ = -(uint)(auStack_1c8._24_4_ == 0 && auStack_1c8._8_4_ == 0);
    auVar35._12_4_ = -(uint)(auStack_1c8._28_4_ == 0 && auStack_1c8._12_4_ == 0);
    iVar1 = movmskps(extraout_EAX_01,auVar35);
    if (iVar1 == 0xf) {
      return;
    }
    pcStack_1d0 = (code *)0x14b52d;
    test_inverse_scalar_cold_2();
    r_01 = (secp256k1_fe *)auStack_1c8;
  }
  pcStack_1d0 = (code *)0x14b538;
  secp256k1_scalar_verify((secp256k1_scalar *)auStack_1c8);
  auVar36._0_4_ = -(uint)(auStack_1c8._16_4_ == 0 && auStack_1c8._0_4_ == 0);
  auVar36._4_4_ = -(uint)(auStack_1c8._20_4_ == 0 && auStack_1c8._4_4_ == 0);
  auVar36._8_4_ = -(uint)(auStack_1c8._24_4_ == 0 && auStack_1c8._8_4_ == 0);
  auVar36._12_4_ = -(uint)(auStack_1c8._28_4_ == 0 && auStack_1c8._12_4_ == 0);
  iVar1 = movmskps(extraout_EAX_02,auVar36);
  r_00 = (secp256k1_fe *)auStack_1c8;
  psVar17 = psVar22;
  if (iVar1 == 0xf) {
    return;
  }
LAB_0014b564:
  pcStack_1d0 = test_hsort;
  test_inverse_scalar_cold_3();
  __s = auStack_1280;
  psStack_1f8 = r_00;
  uStack_1f0 = uVar26;
  uStack_1e8 = uVar28;
  psStack_1e0 = r_01;
  pcStack_1d8 = pcVar32;
  pcStack_1d0 = (code *)uVar13;
  memset(__s,0,0x1081);
  uStack_1290 = 0;
  lVar5 = 0x41;
  psStack_1288 = psVar17;
  secp256k1_hsort(__s,0x41,(size_t)psVar17,test_hsort_cmp,&uStack_1290);
  if (0x3f < uStack_1290) {
    test_hsort_is_sorted(auStack_1280,0x41,(size_t)psVar17);
    if (0 < COUNT) {
      iVar1 = 0;
      do {
        uVar4 = testrand_int(0x41);
        count = (size_t)(int)uVar4;
        testrand_bytes_test(auStack_1280,count * (long)psVar17);
        secp256k1_hsort(auStack_1280,count,(size_t)psVar17,test_hsort_cmp,&uStack_1290);
        test_hsort_is_sorted(auStack_1280,count,(size_t)psVar17);
        iVar1 = iVar1 + 1;
      } while (iVar1 < COUNT);
    }
    return;
  }
  test_hsort_cold_1();
  *extraout_RDX = *extraout_RDX + 1;
  if (extraout_RDX[1] != 0) {
    lVar11 = 0;
    do {
      if (__s[lVar11] != *(uchar *)(lVar5 + lVar11)) {
        return;
      }
      lVar11 = lVar11 + 1;
    } while (extraout_RDX[1] != lVar11);
  }
  return;
}

Assistant:

static void secp256k1_modinv32_normalize_30(secp256k1_modinv32_signed30 *r, int32_t sign, const secp256k1_modinv32_modinfo *modinfo) {
    const int32_t M30 = (int32_t)(UINT32_MAX >> 2);
    int32_t r0 = r->v[0], r1 = r->v[1], r2 = r->v[2], r3 = r->v[3], r4 = r->v[4],
            r5 = r->v[5], r6 = r->v[6], r7 = r->v[7], r8 = r->v[8];
    volatile int32_t cond_add, cond_negate;

#ifdef VERIFY
    /* Verify that all limbs are in range (-2^30,2^30). */
    int i;
    for (i = 0; i < 9; ++i) {
        VERIFY_CHECK(r->v[i] >= -M30);
        VERIFY_CHECK(r->v[i] <= M30);
    }
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(r, 9, &modinfo->modulus, -2) > 0); /* r > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(r, 9, &modinfo->modulus, 1) < 0); /* r < modulus */
#endif

    /* In a first step, add the modulus if the input is negative, and then negate if requested.
     * This brings r from range (-2*modulus,modulus) to range (-modulus,modulus). As all input
     * limbs are in range (-2^30,2^30), this cannot overflow an int32_t. Note that the right
     * shifts below are signed sign-extending shifts (see assumptions.h for tests that that is
     * indeed the behavior of the right shift operator). */
    cond_add = r8 >> 31;
    r0 += modinfo->modulus.v[0] & cond_add;
    r1 += modinfo->modulus.v[1] & cond_add;
    r2 += modinfo->modulus.v[2] & cond_add;
    r3 += modinfo->modulus.v[3] & cond_add;
    r4 += modinfo->modulus.v[4] & cond_add;
    r5 += modinfo->modulus.v[5] & cond_add;
    r6 += modinfo->modulus.v[6] & cond_add;
    r7 += modinfo->modulus.v[7] & cond_add;
    r8 += modinfo->modulus.v[8] & cond_add;
    cond_negate = sign >> 31;
    r0 = (r0 ^ cond_negate) - cond_negate;
    r1 = (r1 ^ cond_negate) - cond_negate;
    r2 = (r2 ^ cond_negate) - cond_negate;
    r3 = (r3 ^ cond_negate) - cond_negate;
    r4 = (r4 ^ cond_negate) - cond_negate;
    r5 = (r5 ^ cond_negate) - cond_negate;
    r6 = (r6 ^ cond_negate) - cond_negate;
    r7 = (r7 ^ cond_negate) - cond_negate;
    r8 = (r8 ^ cond_negate) - cond_negate;
    /* Propagate the top bits, to bring limbs back to range (-2^30,2^30). */
    r1 += r0 >> 30; r0 &= M30;
    r2 += r1 >> 30; r1 &= M30;
    r3 += r2 >> 30; r2 &= M30;
    r4 += r3 >> 30; r3 &= M30;
    r5 += r4 >> 30; r4 &= M30;
    r6 += r5 >> 30; r5 &= M30;
    r7 += r6 >> 30; r6 &= M30;
    r8 += r7 >> 30; r7 &= M30;

    /* In a second step add the modulus again if the result is still negative, bringing r to range
     * [0,modulus). */
    cond_add = r8 >> 31;
    r0 += modinfo->modulus.v[0] & cond_add;
    r1 += modinfo->modulus.v[1] & cond_add;
    r2 += modinfo->modulus.v[2] & cond_add;
    r3 += modinfo->modulus.v[3] & cond_add;
    r4 += modinfo->modulus.v[4] & cond_add;
    r5 += modinfo->modulus.v[5] & cond_add;
    r6 += modinfo->modulus.v[6] & cond_add;
    r7 += modinfo->modulus.v[7] & cond_add;
    r8 += modinfo->modulus.v[8] & cond_add;
    /* And propagate again. */
    r1 += r0 >> 30; r0 &= M30;
    r2 += r1 >> 30; r1 &= M30;
    r3 += r2 >> 30; r2 &= M30;
    r4 += r3 >> 30; r3 &= M30;
    r5 += r4 >> 30; r4 &= M30;
    r6 += r5 >> 30; r5 &= M30;
    r7 += r6 >> 30; r6 &= M30;
    r8 += r7 >> 30; r7 &= M30;

    r->v[0] = r0;
    r->v[1] = r1;
    r->v[2] = r2;
    r->v[3] = r3;
    r->v[4] = r4;
    r->v[5] = r5;
    r->v[6] = r6;
    r->v[7] = r7;
    r->v[8] = r8;

    VERIFY_CHECK(r0 >> 30 == 0);
    VERIFY_CHECK(r1 >> 30 == 0);
    VERIFY_CHECK(r2 >> 30 == 0);
    VERIFY_CHECK(r3 >> 30 == 0);
    VERIFY_CHECK(r4 >> 30 == 0);
    VERIFY_CHECK(r5 >> 30 == 0);
    VERIFY_CHECK(r6 >> 30 == 0);
    VERIFY_CHECK(r7 >> 30 == 0);
    VERIFY_CHECK(r8 >> 30 == 0);
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(r, 9, &modinfo->modulus, 0) >= 0); /* r >= 0 */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(r, 9, &modinfo->modulus, 1) < 0); /* r < modulus */
}